

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O2

BOOL __thiscall
Js::RecyclableTypedArrayWalker::Get
          (RecyclableTypedArrayWalker *this,int i,ResolvedObject *pResolvedObject)

{
  StringBuilder<Memory::ArenaAllocator> *stringBuilder;
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  BOOL BVar4;
  int iVar5;
  undefined4 *puVar6;
  TypedArrayBase *pTVar7;
  uint extraout_var;
  LPCWSTR pWVar8;
  ArenaAllocator *alloc;
  RecyclableTypedArrayAddress *this_00;
  RecyclableArrayWalker *this_01;
  char *this_02;
  char *aValue;
  Type TVar9;
  uint index;
  
  if (pResolvedObject == (ResolvedObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0xcd2,"(pResolvedObject)",
                                "Bad usage of RecyclableTypedArrayWalker::Get");
    if (!bVar2) goto LAB_007ef478;
    *puVar6 = 0;
  }
  bVar2 = VarIs<Js::TypedArrayBase>
                    ((this->super_RecyclableArrayWalker).super_RecyclableObjectWalker.instance);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0xcd4,"(Js::VarIs<Js::TypedArrayBase>(instance))",
                                "Js::VarIs<Js::TypedArrayBase>(instance)");
    if (!bVar2) goto LAB_007ef478;
    *puVar6 = 0;
  }
  pTVar7 = VarTo<Js::TypedArrayBase>
                     ((this->super_RecyclableArrayWalker).super_RecyclableObjectWalker.instance);
  uVar3 = 0;
  if ((this->super_RecyclableArrayWalker).fOnlyOwnProperties == false) {
    uVar3 = RecyclableObjectWalker::GetChildrenCount((RecyclableObjectWalker *)this);
  }
  index = i - uVar3;
  if (i < (int)uVar3) {
    BVar4 = RecyclableObjectWalker::Get((RecyclableObjectWalker *)this,i,pResolvedObject);
    return BVar4;
  }
  pResolvedObject->scriptContext =
       (this->super_RecyclableArrayWalker).super_RecyclableObjectWalker.scriptContext;
  iVar5 = (*(pTVar7->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
            super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x72])(pTVar7,(ulong)index);
  aValue = (char *)CONCAT44(extraout_var,iVar5);
  pResolvedObject->obj = aValue;
  if ((RecyclableArrayWalker *)aValue == (RecyclableArrayWalker *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar2) goto LAB_007ef478;
    *puVar6 = 0;
  }
  this_02 = aValue;
  bVar2 = TaggedInt::Is(aValue);
  if (bVar2) {
    TVar9 = TypeIds_FirstNumberType;
  }
  else if (extraout_var >> 0x12 == 0) {
    this_01 = (RecyclableArrayWalker *)UnsafeVarTo<Js::RecyclableObject>(aValue);
    if (this_01 == (RecyclableArrayWalker *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      aValue = 
      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
      ;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar2) goto LAB_007ef478;
      *puVar6 = 0;
    }
    TVar9 = ((Type *)&(this_01->super_RecyclableObjectWalker).scriptContext)->ptr->typeId;
    this_02 = aValue;
    if ((0x57 < (int)TVar9) &&
       (BVar4 = RecyclableObject::IsExternal((RecyclableObject *)this_01), this_02 = (char *)this_01
       , BVar4 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      this_02 = 
      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
      ;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar2) goto LAB_007ef478;
      *puVar6 = 0;
    }
  }
  else {
    TVar9 = TypeIds_Number;
  }
  pResolvedObject->typeId = TVar9;
  stringBuilder =
       ((this->super_RecyclableArrayWalker).super_RecyclableObjectWalker.scriptContext)->
       threadContext->debugManager->pCurrentInterpreterLocation->stringBuilder;
  if (stringBuilder == (StringBuilder<Memory::ArenaAllocator> *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    this_02 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
    ;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0xce6,"(builder)","builder");
    if (!bVar2) goto LAB_007ef478;
    *puVar6 = 0;
  }
  stringBuilder->length = 0;
  stringBuilder->count = 0;
  stringBuilder->firstChunk = (Data *)0x0;
  stringBuilder->secondChunk = (Data *)0x0;
  stringBuilder->lastChunk = (Data *)0x0;
  pWVar8 = RecyclableArrayWalker::GetIndexName((RecyclableArrayWalker *)this_02,index,stringBuilder)
  ;
  pResolvedObject->name = pWVar8;
  if (pResolvedObject->typeId == TypeIds_HostDispatch) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0xcea,"(pResolvedObject->typeId != TypeIds_HostDispatch)",
                                "pResolvedObject->typeId != TypeIds_HostDispatch");
    if (!bVar2) {
LAB_007ef478:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
  }
  alloc = GetArenaFromContext((this->super_RecyclableArrayWalker).super_RecyclableObjectWalker.
                              scriptContext);
  this_00 = (RecyclableTypedArrayAddress *)new<Memory::ArenaAllocator>(0x18,alloc,0x35916e);
  RecyclableTypedArrayAddress::RecyclableTypedArrayAddress
            (this_00,(this->super_RecyclableArrayWalker).super_RecyclableObjectWalker.instance,index
            );
  pResolvedObject->address = (IDiagObjectAddress *)this_00;
  return 1;
}

Assistant:

BOOL RecyclableTypedArrayWalker::Get(int i, ResolvedObject* pResolvedObject)
    {
        AssertMsg(pResolvedObject, "Bad usage of RecyclableTypedArrayWalker::Get");

        Assert(Js::VarIs<Js::TypedArrayBase>(instance));

        Js::TypedArrayBase * typedArrayObj = Js::VarTo<Js::TypedArrayBase>(instance);

        int nonArrayElementCount = (!fOnlyOwnProperties ? RecyclableObjectWalker::GetChildrenCount() : 0);

        if (i < nonArrayElementCount)
        {
            return RecyclableObjectWalker::Get(i, pResolvedObject);
        }
        else
        {
            i -= nonArrayElementCount;
            pResolvedObject->scriptContext = scriptContext;
            pResolvedObject->obj = typedArrayObj->DirectGetItem(i);
            pResolvedObject->typeId = JavascriptOperators::GetTypeId(pResolvedObject->obj);

            StringBuilder<ArenaAllocator>* builder = GetBuilder();
            Assert(builder);
            builder->Reset();
            pResolvedObject->name = GetIndexName(i, builder);

            Assert(pResolvedObject->typeId != TypeIds_HostDispatch);

            pResolvedObject->address = Anew(GetArenaFromContext(scriptContext),
                RecyclableTypedArrayAddress,
                instance,
                i);
        }

        return TRUE;
    }